

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O3

void ARGBToARGB4444Row_SSE2(uint8_t *src,uint8_t *dst,int width)

{
  bool bVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  ushort uVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  int iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  auVar15[8] = 0xff;
  auVar15._0_8_ = 0xffffffffffffffff;
  auVar15[9] = 0xff;
  auVar15[10] = 0xff;
  auVar15[0xb] = 0xff;
  auVar15[0xc] = 0xff;
  auVar15[0xd] = 0xff;
  auVar15[0xe] = 0xff;
  auVar15[0xf] = 0xff;
  auVar15 = psllw(auVar15,0xc);
  auVar14._0_2_ = auVar15._0_2_ >> 8;
  auVar14._2_2_ = auVar15._2_2_ >> 8;
  auVar14._4_2_ = auVar15._4_2_ >> 8;
  auVar14._6_2_ = auVar15._6_2_ >> 8;
  auVar14._8_2_ = auVar15._8_2_ >> 8;
  auVar14._10_2_ = auVar15._10_2_ >> 8;
  auVar14._12_2_ = auVar15._12_2_ >> 8;
  auVar14._14_2_ = auVar15._14_2_ >> 8;
  do {
    auVar11 = *(undefined1 (*) [16])src & auVar14;
    auVar13 = *(undefined1 (*) [16])src & auVar15;
    auVar12._0_8_ = auVar11._0_8_ >> 4;
    auVar12._8_8_ = auVar11._8_8_ >> 4;
    auVar11._0_8_ = auVar13._0_8_ >> 8;
    auVar11._8_8_ = auVar13._8_8_ >> 8;
    auVar12 = auVar12 | auVar11;
    sVar2 = auVar12._0_2_;
    sVar3 = auVar12._2_2_;
    sVar4 = auVar12._4_2_;
    uVar5 = auVar12._6_2_;
    sVar6 = auVar12._8_2_;
    sVar7 = auVar12._10_2_;
    sVar8 = auVar12._12_2_;
    sVar9 = auVar12._14_2_;
    src = (uint8_t *)((long)src + 0x10);
    *(ulong *)dst =
         CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar12[0xe] - (0xff < sVar9),
                  CONCAT16((0 < sVar8) * (sVar8 < 0x100) * auVar12[0xc] - (0xff < sVar8),
                           CONCAT15((0 < sVar7) * (sVar7 < 0x100) * auVar12[10] - (0xff < sVar7),
                                    CONCAT14((0 < sVar6) * (sVar6 < 0x100) * auVar12[8] -
                                             (0xff < sVar6),
                                             CONCAT13((uVar5 != 0) * (uVar5 < 0x100) * auVar12[6] -
                                                      (0xff < uVar5),
                                                      CONCAT12((0 < sVar4) * (sVar4 < 0x100) *
                                                               auVar12[4] - (0xff < sVar4),
                                                               CONCAT11((0 < sVar3) *
                                                                        (sVar3 < 0x100) * auVar12[2]
                                                                        - (0xff < sVar3),
                                                                        (0 < sVar2) *
                                                                        (sVar2 < 0x100) * auVar12[0]
                                                                        - (0xff < sVar2))))))));
    dst = dst + 8;
    iVar10 = width + -4;
    bVar1 = 3 < width;
    width = iVar10;
  } while (iVar10 != 0 && bVar1);
  return;
}

Assistant:

void ARGBToARGB4444Row_SSE2(const uint8_t* src, uint8_t* dst, int width) {
  asm volatile(
      "pcmpeqb     %%xmm4,%%xmm4                 \n"
      "psllw       $0xc,%%xmm4                   \n"
      "movdqa      %%xmm4,%%xmm3                 \n"
      "psrlw       $0x8,%%xmm3                   \n"

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqa      %%xmm0,%%xmm1                 \n"
      "pand        %%xmm3,%%xmm0                 \n"
      "pand        %%xmm4,%%xmm1                 \n"
      "psrlq       $0x4,%%xmm0                   \n"
      "psrlq       $0x8,%%xmm1                   \n"
      "por         %%xmm1,%%xmm0                 \n"
      "packuswb    %%xmm0,%%xmm0                 \n"
      "lea         0x10(%0),%0                   \n"
      "movq        %%xmm0,(%1)                   \n"
      "lea         0x8(%1),%1                    \n"
      "sub         $0x4,%2                       \n"
      "jg          1b                            \n"
      : "+r"(src),   // %0
        "+r"(dst),   // %1
        "+r"(width)  // %2
        ::"memory",
        "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4");
}